

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraph_p.h
# Opt level: O3

QList<QtGraphicsAnchorLayout::AnchorVertex_*> * __thiscall
Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::adjacentVertices
          (QList<QtGraphicsAnchorLayout::AnchorVertex_*> *__return_storage_ptr__,
          Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData> *this,
          AnchorVertex *vertex)

{
  Span *pSVar1;
  ulong uVar2;
  long in_FS_OFFSET;
  const_iterator cVar3;
  AnchorVertex *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = vertex;
  cVar3 = QHash<QtGraphicsAnchorLayout::AnchorVertex*,QHash<QtGraphicsAnchorLayout::AnchorVertex*,QtGraphicsAnchorLayout::AnchorData*>>
          ::constFindImpl<QtGraphicsAnchorLayout::AnchorVertex*>
                    ((QHash<QtGraphicsAnchorLayout::AnchorVertex*,QHash<QtGraphicsAnchorLayout::AnchorVertex*,QtGraphicsAnchorLayout::AnchorData*>>
                      *)this,&local_18);
  if (cVar3.i.d ==
      (Data<QHashPrivate::Node<QtGraphicsAnchorLayout::AnchorVertex_*,_QHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorData_*>_>_>
       *)0x0 && cVar3.i.bucket == 0) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (AnchorVertex **)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    pSVar1 = (cVar3.i.d)->spans;
    uVar2 = cVar3.i.bucket >> 7;
    QHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorData_*>::keys
              (__return_storage_ptr__,
               (QHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorData_*>
                *)(pSVar1[uVar2].entries[pSVar1[uVar2].offsets[(uint)cVar3.i.bucket & 0x7f]].storage
                   .data + 8));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<Vertex *> adjacentVertices(Vertex *vertex) const
    {
        const auto it = m_graph.constFind(vertex);
        if (it == m_graph.cend())
            return QList<Vertex *>();
        else
            return it->keys();
    }